

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O3

void flatcc_json_printer_int64_vector_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len)

{
  uint64_t uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  uint64_t uVar7;
  uint *puVar8;
  uint64_t *puVar9;
  ulong __n;
  char *pcVar10;
  ulong uVar11;
  size_t sVar12;
  
  uVar2 = id * 2 + 4;
  if ((uVar2 < (uint)td->vsize) &&
     (uVar11 = (ulong)*(ushort *)((long)td->vtable + (ulong)uVar2), uVar11 != 0)) {
    puVar8 = (uint *)(uVar11 + (long)td->table);
    iVar5 = td->count;
    td->count = iVar5 + 1;
    if (iVar5 != 0) {
      pcVar10 = ctx->p;
      ctx->p = pcVar10 + 1;
      *pcVar10 = ',';
    }
    uVar11 = (ulong)*puVar8;
    iVar5 = *(int *)((long)puVar8 + uVar11);
    print_name(ctx,name,len);
    ctx->level = ctx->level + 1;
    pcVar10 = ctx->p;
    ctx->p = pcVar10 + 1;
    *pcVar10 = '[';
    if (iVar5 == 0) {
      pcVar10 = ctx->p;
    }
    else {
      pcVar10 = ctx->p;
      if (ctx->indent == '\0') {
        if (ctx->pflush <= pcVar10) {
          (*ctx->flush)(ctx,0);
          pcVar10 = ctx->p;
        }
      }
      else {
        ctx->p = pcVar10 + 1;
        *pcVar10 = '\n';
        __n = (ulong)ctx->indent * (long)ctx->level;
        pcVar10 = ctx->pflush;
        pcVar6 = ctx->p;
        if (pcVar10 < pcVar6 + __n) {
          if (pcVar10 <= pcVar6) {
            (*ctx->flush)(ctx,0);
            pcVar10 = ctx->pflush;
            pcVar6 = ctx->p;
          }
          sVar12 = (long)pcVar10 - (long)pcVar6;
          if (sVar12 < __n) {
            do {
              memset(pcVar6,0x20,sVar12);
              ctx->p = ctx->p + sVar12;
              __n = __n - sVar12;
              (*ctx->flush)(ctx,0);
              pcVar6 = ctx->p;
              sVar12 = (long)ctx->pflush - (long)pcVar6;
            } while (sVar12 < __n);
          }
        }
        memset(pcVar6,0x20,__n);
        pcVar10 = ctx->p + __n;
        ctx->p = pcVar10;
      }
      uVar1 = *(uint64_t *)((long)puVar8 + uVar11 + 4);
      uVar7 = uVar1;
      if ((long)uVar1 < 0) {
        *pcVar10 = '-';
        pcVar10 = pcVar10 + 1;
        uVar7 = -uVar1;
      }
      iVar3 = print_uint64(uVar7,pcVar10);
      pcVar10 = ctx->p + (uint)(iVar3 - (int)((long)uVar1 >> 0x3f));
      iVar5 = iVar5 + -1;
      if (iVar5 != 0) {
        puVar9 = (uint64_t *)((long)puVar8 + uVar11 + 0xc);
        do {
          ctx->p = pcVar10 + 1;
          *pcVar10 = ',';
          pcVar10 = ctx->p;
          if (ctx->indent == '\0') {
            if (ctx->pflush <= pcVar10) {
              (*ctx->flush)(ctx,0);
              pcVar10 = ctx->p;
            }
          }
          else {
            ctx->p = pcVar10 + 1;
            *pcVar10 = '\n';
            uVar11 = (ulong)ctx->indent * (long)ctx->level;
            pcVar10 = ctx->pflush;
            pcVar6 = ctx->p;
            if (pcVar10 < pcVar6 + uVar11) {
              if (pcVar10 <= pcVar6) {
                (*ctx->flush)(ctx,0);
                pcVar10 = ctx->pflush;
                pcVar6 = ctx->p;
              }
              sVar12 = (long)pcVar10 - (long)pcVar6;
              if (sVar12 < uVar11) {
                do {
                  memset(pcVar6,0x20,sVar12);
                  ctx->p = ctx->p + sVar12;
                  uVar11 = uVar11 - sVar12;
                  (*ctx->flush)(ctx,0);
                  pcVar6 = ctx->p;
                  sVar12 = (long)ctx->pflush - (long)pcVar6;
                } while (sVar12 < uVar11);
              }
            }
            memset(pcVar6,0x20,uVar11);
            pcVar10 = ctx->p + uVar11;
            ctx->p = pcVar10;
          }
          uVar1 = *puVar9;
          uVar7 = uVar1;
          if ((long)uVar1 < 0) {
            *pcVar10 = '-';
            pcVar10 = pcVar10 + 1;
            uVar7 = -uVar1;
          }
          iVar5 = iVar5 + -1;
          iVar3 = print_uint64(uVar7,pcVar10);
          pcVar10 = ctx->p + (uint)(iVar3 - (int)((long)uVar1 >> 0x3f));
          ctx->p = pcVar10;
          puVar9 = puVar9 + 1;
        } while (iVar5 != 0);
      }
    }
    if (ctx->indent != '\0') {
      ctx->p = pcVar10 + 1;
      *pcVar10 = '\n';
      lVar4 = (long)ctx->level + -1;
      ctx->level = (int)lVar4;
      uVar11 = (ulong)ctx->indent * lVar4;
      pcVar10 = ctx->pflush;
      pcVar6 = ctx->p;
      if (pcVar10 < pcVar6 + uVar11) {
        if (pcVar10 <= pcVar6) {
          (*ctx->flush)(ctx,0);
          pcVar10 = ctx->pflush;
          pcVar6 = ctx->p;
        }
        sVar12 = (long)pcVar10 - (long)pcVar6;
        if (sVar12 < uVar11) {
          do {
            memset(pcVar6,0x20,sVar12);
            ctx->p = ctx->p + sVar12;
            uVar11 = uVar11 - sVar12;
            (*ctx->flush)(ctx,0);
            pcVar6 = ctx->p;
            sVar12 = (long)ctx->pflush - (long)pcVar6;
          } while (sVar12 < uVar11);
        }
      }
      memset(pcVar6,0x20,uVar11);
      pcVar10 = ctx->p + uVar11;
    }
    ctx->p = pcVar10 + 1;
    *pcVar10 = ']';
  }
  return;
}

Assistant:

static inline const void *get_field_ptr(flatcc_json_printer_table_descriptor_t *td, int id)
{
    uoffset_t vo = (uoffset_t)(id + 2) * (uoffset_t)sizeof(voffset_t);

    if (vo >= (uoffset_t)td->vsize) {
        return 0;
    }
    vo = read_voffset(td->vtable, vo);
    if (vo == 0) {
        return 0;
    }
    return (uint8_t *)td->table + vo;
}